

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Consume(ParserImpl *this,string *value)

{
  bool bVar1;
  Token *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Tokenizer *in_stack_00000008;
  string *current_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ParserImpl *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  bool local_1;
  
  pTVar2 = io::Tokenizer::current((Tokenizer *)&in_RDI[1]._M_string_length);
  local_20 = &pTVar2->text;
  bVar1 = std::operator!=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (bVar1) {
    __rhs = &local_a0;
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+(in_RDI,(char *)__rhs);
    std::operator+(in_RDI,__rhs);
    std::operator+(in_RDI,(char *)__rhs);
    ReportError(in_stack_ffffffffffffff50,in_RDI);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    io::Tokenizer::Next(in_stack_00000008);
  }
  local_1 = !bVar1;
  return local_1;
}

Assistant:

bool Consume(const std::string& value) {
    const std::string& current_value = tokenizer_.current().text;

    if (current_value != value) {
      ReportError("Expected \"" + value + "\", found \"" + current_value +
                  "\".");
      return false;
    }

    tokenizer_.Next();

    return true;
  }